

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O0

error neg<52>(context *ctx,token *token,opcode *op)

{
  opcode *in_RCX;
  token local_50;
  opcode *op_local;
  token *token_local;
  context *ctx_local;
  
  op_local = op;
  token_local = token;
  ctx_local = ctx;
  if (op[1].reuse == 7) {
    opcode::add_bits(in_RCX,0x10000000000000);
    context::tokenize(&local_50,(context *)token_local);
    memcpy(op_local,&local_50,0x24);
  }
  memset(ctx,0,8);
  error::error((error *)ctx);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

DEFINE_OPERAND(neg)
{
    if (token.type == token_type::minus) {
        op.add_bits(1ULL << address);
        token = ctx.tokenize();
    }
    return {};
}